

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

int bpmnode_compare(void *a,void *b)

{
  int iVar1;
  
  if (*a < *b) {
    iVar1 = -1;
  }
  else {
    if (*a <= *b) {
      return (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) - 1 | 1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int bpmnode_compare(const void* a, const void* b)
{
  int wa = ((const BPMNode*)a)->weight;
  int wb = ((const BPMNode*)b)->weight;
  if(wa < wb) return -1;
  if(wa > wb) return 1;
  /*make the qsort a stable sort*/
  return ((const BPMNode*)a)->index < ((const BPMNode*)b)->index ? 1 : -1;
}